

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O0

_Bool borg_is_ammo(int tval)

{
  int tval_local;
  
  return tval - 2U < 3;
}

Assistant:

bool borg_is_ammo(int tval)
{
    switch (tval) {
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT:
        return true;
    default:
        return false;
    }
}